

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnRefFuncExpr
          (BinaryReaderInterp *this,Index func_index)

{
  Result RVar1;
  Location LStack_98;
  Var local_70;
  
  LStack_98.field_1.field_0.line = 0;
  LStack_98.field_1._4_8_ = 0;
  LStack_98.filename.data_ = (char *)0x0;
  LStack_98.filename.size_._0_4_ = 0;
  LStack_98.filename.size_._4_4_ = 0;
  Var::Var(&local_70,func_index,&LStack_98);
  RVar1 = SharedValidator::OnRefFunc
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     &local_70);
  Var::~Var(&local_70);
  if (RVar1.enum_ != Error) {
    Istream::Emit(this->istream_,RefFunc,func_index);
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::OnRefFuncExpr(Index func_index) {
  CHECK_RESULT(validator_.OnRefFunc(loc, Var(func_index)));
  istream_.Emit(Opcode::RefFunc, func_index);
  return Result::Ok;
}